

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void fill_xrange(chunk_conflict *c,wchar_t y,wchar_t x1,wchar_t x2,wchar_t feat,wchar_t flag,
                _Bool light)

{
  loc_conflict grid_00;
  square_conflict *psVar1;
  loc grid;
  wchar_t x;
  _Bool light_local;
  wchar_t flag_local;
  wchar_t feat_local;
  wchar_t x2_local;
  wchar_t x1_local;
  wchar_t y_local;
  chunk_conflict *c_local;
  
  for (grid.x = x1; grid.x <= x2; grid.x = grid.x + 1) {
    grid_00 = (loc_conflict)loc(grid.x,y);
    square_set_feat((chunk *)c,grid_00,feat);
    psVar1 = square((chunk *)c,grid_00);
    flag_on_dbg(psVar1->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
    if (flag != L'\0') {
      psVar1 = square((chunk *)c,grid_00);
      flag_on_dbg(psVar1->info,3,flag,"square(c, grid)->info","flag");
    }
    if (light) {
      psVar1 = square((chunk *)c,grid_00);
      flag_on_dbg(psVar1->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
    }
  }
  return;
}

Assistant:

static void fill_xrange(struct chunk *c, int y, int x1, int x2, int feat, 
						int flag, bool light)
{
	int x;
	for (x = x1; x <= x2; x++) {
		struct loc grid = loc(x, y);
		square_set_feat(c, grid, feat);
		sqinfo_on(square(c, grid)->info, SQUARE_ROOM);
		if (flag) sqinfo_on(square(c, grid)->info, flag);
		if (light)
			sqinfo_on(square(c, grid)->info, SQUARE_GLOW);
	}
}